

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dbl.c
# Opt level: O0

void arg_dbl_errorfn(arg_dbl *parent,arg_dstr_t ds,int errorcode,char *argval,char *progname)

{
  char *shortopts_00;
  char *longopts_00;
  char *datatype_00;
  char *local_50;
  char *datatype;
  char *longopts;
  char *shortopts;
  char *progname_local;
  char *argval_local;
  int errorcode_local;
  arg_dstr_t ds_local;
  arg_dbl *parent_local;
  
  shortopts_00 = (parent->hdr).shortopts;
  longopts_00 = (parent->hdr).longopts;
  datatype_00 = (parent->hdr).datatype;
  local_50 = argval;
  if (argval == (char *)0x0) {
    local_50 = "";
  }
  arg_dstr_catf(ds,"%s: ",progname);
  if (errorcode == 1) {
    arg_dstr_cat(ds,"missing option ");
    arg_print_option_ds(ds,shortopts_00,longopts_00,datatype_00,"\n");
  }
  else if (errorcode == 2) {
    arg_dstr_cat(ds,"excess option ");
    arg_print_option_ds(ds,shortopts_00,longopts_00,local_50,"\n");
  }
  else if (errorcode == 5) {
    arg_dstr_catf(ds,"invalid argument \"%s\" to option ",local_50);
    arg_print_option_ds(ds,shortopts_00,longopts_00,datatype_00,"\n");
  }
  return;
}

Assistant:

static void arg_dbl_errorfn(struct arg_dbl* parent, arg_dstr_t ds, int errorcode, const char* argval, const char* progname) {
    const char* shortopts = parent->hdr.shortopts;
    const char* longopts = parent->hdr.longopts;
    const char* datatype = parent->hdr.datatype;

    /* make argval NULL safe */
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (errorcode) {
        case ARG_ERR_MINCOUNT:
            arg_dstr_cat(ds, "missing option ");
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;

        case ARG_ERR_MAXCOUNT:
            arg_dstr_cat(ds, "excess option ");
            arg_print_option_ds(ds, shortopts, longopts, argval, "\n");
            break;

        case ARG_ERR_BADDOUBLE:
            arg_dstr_catf(ds, "invalid argument \"%s\" to option ", argval);
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;
    }
}